

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

UBool icu_63::UnicodeSet::resemblesPropertyPattern(RuleCharacterIterator *chars,int32_t iterOpts)

{
  UBool UVar1;
  UChar32 UVar2;
  UChar32 UVar3;
  bool local_3b;
  bool local_3a;
  bool local_39;
  UChar32 d;
  UChar32 c;
  Pos pos;
  UBool local_16;
  bool local_15;
  UErrorCode ec;
  UBool literal;
  UBool result;
  RuleCharacterIterator *pRStack_10;
  int32_t iterOpts_local;
  RuleCharacterIterator *chars_local;
  
  local_15 = false;
  pos.bufPos = 0;
  ec = iterOpts & ~U_MISSING_RESOURCE_ERROR;
  pRStack_10 = chars;
  RuleCharacterIterator::getPos(chars,(Pos *)&d);
  UVar2 = RuleCharacterIterator::next(pRStack_10,ec,&local_16,&pos.bufPos);
  if ((UVar2 == 0x5b) || (UVar2 == 0x5c)) {
    UVar3 = RuleCharacterIterator::next(pRStack_10,ec & ~U_FILE_ACCESS_ERROR,&local_16,&pos.bufPos);
    if (UVar2 == 0x5b) {
      local_39 = UVar3 == 0x3a;
    }
    else {
      local_3a = true;
      if ((UVar3 != 0x4e) && (local_3a = true, UVar3 != 0x70)) {
        local_3a = UVar3 == 0x50;
      }
      local_39 = local_3a;
    }
    local_15 = local_39;
  }
  RuleCharacterIterator::setPos(pRStack_10,(Pos *)&d);
  local_3b = false;
  if (local_15 != false) {
    UVar1 = ::U_SUCCESS(pos.bufPos);
    local_3b = UVar1 != '\0';
  }
  return local_3b;
}

Assistant:

UBool UnicodeSet::resemblesPropertyPattern(RuleCharacterIterator& chars,
                                           int32_t iterOpts) {
    // NOTE: literal will always be FALSE, because we don't parse escapes.
    UBool result = FALSE, literal;
    UErrorCode ec = U_ZERO_ERROR;
    iterOpts &= ~RuleCharacterIterator::PARSE_ESCAPES;
    RuleCharacterIterator::Pos pos;
    chars.getPos(pos);
    UChar32 c = chars.next(iterOpts, literal, ec);
    if (c == 0x5B /*'['*/ || c == 0x5C /*'\\'*/) {
        UChar32 d = chars.next(iterOpts & ~RuleCharacterIterator::SKIP_WHITESPACE,
                               literal, ec);
        result = (c == 0x5B /*'['*/) ? (d == 0x3A /*':'*/) :
                 (d == 0x4E /*'N'*/ || d == 0x70 /*'p'*/ || d == 0x50 /*'P'*/);
    }
    chars.setPos(pos);
    return result && U_SUCCESS(ec);
}